

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallDirectoryGenerator::GenerateScriptForConfig
          (cmInstallDirectoryGenerator *this,ostream *os,string *config,Indent indent)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  long *plVar3;
  ulong *puVar4;
  cmState *pcVar5;
  pointer pbVar6;
  allocator local_e1;
  undefined1 local_e0 [32];
  string local_c0;
  Indent local_9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmState *local_68;
  ostream *local_58;
  cmGeneratorExpression ge;
  
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dirs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_e0);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_e0);
  local_9c.Level = indent.Level;
  local_58 = os;
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_e0);
  pbVar6 = (this->Directories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar6 != (this->Directories).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)&ge);
      cge.x_ = (cmCompiledGeneratorExpression *)local_e0._0_8_;
      local_e0._0_8_ = (cmState *)0x0;
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
                ((auto_ptr<cmCompiledGeneratorExpression> *)local_e0);
      local_c0._M_string_length = 0;
      local_c0.field_2._M_allocated_capacity =
           local_c0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar2 = cmCompiledGeneratorExpression::Evaluate
                         (cge.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_c0)
      ;
      std::__cxx11::string::string((string *)local_e0,pcVar2,&local_e1);
      cmSystemTools::ExpandListArgument((string *)local_e0,&dirs,false);
      if ((cmState *)local_e0._0_8_ != (cmState *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != (this->Directories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      dirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = this->LocalGenerator->Makefile;
    pbVar6 = dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar1 = cmsys::SystemTools::FileIsFullPath((pbVar6->_M_dataplus)._M_p);
      if (!bVar1) {
        pcVar2 = cmMakefile::GetCurrentSourceDirectory(this_00);
        std::__cxx11::string::string((string *)&cge,pcVar2,&local_e1);
        plVar3 = (long *)std::__cxx11::string::append((char *)&cge);
        puVar4 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4) {
          local_c0.field_2._M_allocated_capacity = *puVar4;
          local_c0.field_2._8_8_ = plVar3[3];
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *puVar4;
          local_c0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_c0._M_string_length = plVar3[1];
        *plVar3 = (long)puVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_c0,(ulong)(pbVar6->_M_dataplus)._M_p);
        pcVar5 = (cmState *)(plVar3 + 2);
        if ((cmState *)*plVar3 == pcVar5) {
          local_e0._16_8_ = *(undefined8 *)&(pcVar5->PropertyDefinitions)._M_t._M_impl;
          local_e0._24_8_ = plVar3[3];
          local_e0._0_8_ = (cmState *)(local_e0 + 0x10);
        }
        else {
          local_e0._16_8_ = *(undefined8 *)&(pcVar5->PropertyDefinitions)._M_t._M_impl;
          local_e0._0_8_ = (cmState *)*plVar3;
        }
        local_e0._8_8_ = plVar3[1];
        *plVar3 = (long)pcVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)pbVar6,(string *)local_e0);
        if ((cmState *)local_e0._0_8_ != (cmState *)(local_e0 + 0x10)) {
          operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (cge.x_ != (cmCompiledGeneratorExpression *)&stack0xffffffffffffff98) {
          operator_delete(cge.x_,(ulong)&(local_68->PropertyDefinitions)._M_t._M_impl.field_0x1);
        }
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != dirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  AddDirectoryInstallRule(this,local_58,config,local_9c,&dirs);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dirs);
  return;
}

Assistant:

void cmInstallDirectoryGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  std::vector<std::string> dirs;
  cmGeneratorExpression ge;
  for (std::vector<std::string>::const_iterator i = this->Directories.begin();
       i != this->Directories.end(); ++i) {
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config), dirs);
  }

  // Make sure all dirs have absolute paths.
  cmMakefile const& mf = *this->LocalGenerator->GetMakefile();
  for (std::vector<std::string>::iterator i = dirs.begin(); i != dirs.end();
       ++i) {
    if (!cmSystemTools::FileIsFullPath(i->c_str())) {
      *i = std::string(mf.GetCurrentSourceDirectory()) + "/" + *i;
    }
  }

  this->AddDirectoryInstallRule(os, config, indent, dirs);
}